

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

int State_insert(state *data,config *key)

{
  uint uVar1;
  s_x3node *__ptr;
  config *a;
  size_t __nmemb;
  s_x3 *psVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  s_x3node *psVar6;
  ulong uVar7;
  ulong uVar8;
  state *psVar9;
  state *psVar10;
  state **ppsVar11;
  int iVar12;
  long lVar13;
  s_x3node *psVar14;
  
  psVar2 = x3a;
  if (x3a != (s_x3 *)0x0) {
    uVar3 = statehash(key);
    iVar12 = psVar2->size;
    uVar7 = (ulong)(iVar12 - 1U & uVar3);
    psVar14 = (s_x3node *)psVar2->ht;
    ppsVar11 = &psVar14->data + uVar7;
    do {
      psVar9 = *ppsVar11;
      if (psVar9 == (state *)0x0) {
        uVar1 = psVar2->count;
        if ((int)uVar1 < iVar12) {
          psVar6 = psVar2->tbl;
        }
        else {
          __nmemb = (long)iVar12 * 2;
          psVar6 = (s_x3node *)calloc(__nmemb,0x28);
          if (psVar6 == (s_x3node *)0x0) {
            return 0;
          }
          psVar14 = psVar6 + (long)iVar12 * 2;
          uVar7 = 0;
          iVar12 = (int)__nmemb;
          uVar8 = 0;
          if (0 < iVar12) {
            uVar8 = __nmemb & 0xffffffff;
          }
          for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
            (&psVar14->data)[uVar7] = (state *)0x0;
          }
          lVar13 = 0;
          uVar7 = 0;
          if (0 < (int)uVar1) {
            uVar7 = (ulong)uVar1;
          }
          for (; __ptr = psVar2->tbl, uVar7 * 0x20 != lVar13; lVar13 = lVar13 + 0x20) {
            a = *(config **)((long)&__ptr->key + lVar13);
            uVar5 = statehash(a);
            ppsVar11 = &psVar14->data + (uVar5 & iVar12 - 1U);
            if (*ppsVar11 == (state *)0x0) {
              psVar9 = (state *)0x0;
            }
            else {
              (*ppsVar11)->ap = (action *)((long)&psVar6->next + lVar13);
              psVar9 = *ppsVar11;
            }
            *(state **)((long)&psVar6->next + lVar13) = psVar9;
            *(config **)((long)&psVar6->key + lVar13) = a;
            *(undefined8 *)((long)&psVar6->data + lVar13) =
                 *(undefined8 *)((long)&__ptr->data + lVar13);
            *(state ***)((long)&psVar6->from + lVar13) = ppsVar11;
            *ppsVar11 = (state *)((long)&psVar6->data + lVar13);
          }
          free(__ptr);
          psVar2->size = iVar12;
          psVar2->tbl = psVar6;
          psVar2->ht = (s_x3node **)psVar14;
          uVar7 = (ulong)(iVar12 - 1U & uVar3);
        }
        psVar2->count = uVar1 + 1;
        psVar9 = (state *)(psVar6 + (int)uVar1);
        psVar6[(int)uVar1].key = key;
        psVar6[(int)uVar1].data = data;
        if ((&psVar14->data)[uVar7] == (state *)0x0) {
          psVar10 = (state *)0x0;
        }
        else {
          (&psVar14->data)[uVar7]->ap = (action *)&psVar9->statenum;
          psVar10 = (&psVar14->data)[uVar7];
        }
        *(state **)&psVar9->statenum = psVar10;
        (&psVar14->data)[uVar7] = psVar9;
        psVar9->ap = (action *)(psVar2->ht + uVar7);
        return 1;
      }
      iVar4 = statecmp(psVar9->cfp,key);
      ppsVar11 = (state **)&psVar9->statenum;
    } while (iVar4 != 0);
  }
  return 0;
}

Assistant:

int State_insert(struct state *data, struct config *key)
{
  x3node *np;
  unsigned h;
  unsigned ph;

  if( x3a==0 ) return 0;
  ph = statehash(key);
  h = ph & (x3a->size-1);
  np = x3a->ht[h];
  while( np ){
    if( statecmp(np->key,key)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x3a->count>=x3a->size ){
    /* Need to make the hash table bigger */
    int i,arrSize;
    struct s_x3 array;
    array.size = arrSize = x3a->size*2;
    array.count = x3a->count;
    array.tbl = (x3node*)calloc(arrSize, sizeof(x3node) + sizeof(x3node*));
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x3node**)&(array.tbl[arrSize]);
    for(i=0; i<arrSize; i++) array.ht[i] = 0;
    for(i=0; i<x3a->count; i++){
      x3node *oldnp, *newnp;
      oldnp = &(x3a->tbl[i]);
      h = statehash(oldnp->key) & (arrSize-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->key = oldnp->key;
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x3a->tbl);
    *x3a = array;
  }
  /* Insert the new data */
  h = ph & (x3a->size-1);
  np = &(x3a->tbl[x3a->count++]);
  np->key = key;
  np->data = data;
  if( x3a->ht[h] ) x3a->ht[h]->from = &(np->next);
  np->next = x3a->ht[h];
  x3a->ht[h] = np;
  np->from = &(x3a->ht[h]);
  return 1;
}